

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::
     SerReadWriteMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr&,Wrapper<CustomUintFormatter<2,true>,unsigned_short&>>
               (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
                *s,CNetAddr *args,Wrapper<CustomUintFormatter<2,_true>,_unsigned_short_&> *args_1)

{
  long lVar1;
  CNetAddr *in_RDX;
  ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *in_RSI;
  long in_FS_OFFSET;
  Wrapper<CustomUintFormatter<2,_true>,_unsigned_short_&> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr&,Wrapper<CustomUintFormatter<2,true>,unsigned_short&>&>
            (in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }